

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordset.cpp
# Opt level: O3

void __thiscall wordset::create_inserts(wordset *this,string *word)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  size_type __pos;
  string temp;
  ulong local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = word->_M_string_length;
  if (uVar3 != 0) {
    local_60 = 0;
    do {
      lVar2 = DAT_001091a0;
      if (DAT_001091a0 != 0) {
        lVar4 = 0;
        do {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar1 = (word->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,pcVar1 + word->_M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_60,0,'\x01');
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->edits,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          lVar4 = lVar4 + 1;
        } while (lVar2 != lVar4);
        uVar3 = word->_M_string_length;
      }
      local_60 = local_60 + 1;
    } while (local_60 < uVar3);
  }
  return;
}

Assistant:

void wordset::create_inserts(const string &word) {
    for (int i = 0; i < word.length(); ++i) {
        for (char c : alphabet) {
            string temp = word;
            temp.insert(temp.begin()+i, c);
            edits.insert(temp);
        }
    }
}